

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

uint32_t re2c::unmap(Span *new_span,Span *old_span,uint32_t old_nspans,State *x)

{
  uint local_30;
  uint local_2c;
  uint32_t i;
  uint32_t new_nspans;
  State *x_local;
  uint32_t old_nspans_local;
  Span *old_span_local;
  Span *new_span_local;
  
  local_2c = 0;
  for (local_30 = 0; local_30 < old_nspans; local_30 = local_30 + 1) {
    if (old_span[local_30].to != x) {
      if ((local_2c == 0) || (new_span[local_2c - 1].to != old_span[local_30].to)) {
        new_span[local_2c].to = old_span[local_30].to;
        new_span[local_2c].ub = old_span[local_30].ub;
        local_2c = local_2c + 1;
      }
      else {
        new_span[local_2c - 1].ub = old_span[local_30].ub;
      }
    }
  }
  if (local_2c != 0) {
    new_span[local_2c - 1].ub = old_span[old_nspans - 1].ub;
  }
  return local_2c;
}

Assistant:

uint32_t unmap (Span * new_span, const Span * old_span, uint32_t old_nspans, const State * x)
{
	uint32_t new_nspans = 0;
	for (uint32_t i = 0; i < old_nspans; ++i)
	{
		if (old_span[i].to != x)
		{
			if (new_nspans > 0 && new_span[new_nspans - 1].to == old_span[i].to)
				new_span[new_nspans - 1].ub = old_span[i].ub;
			else
			{
				new_span[new_nspans].to = old_span[i].to;
				new_span[new_nspans].ub = old_span[i].ub;
				++new_nspans;
			}
		}
	}
	if (new_nspans > 0)
		new_span[new_nspans - 1].ub = old_span[old_nspans - 1].ub;
	return new_nspans;
}